

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O0

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
duckdb::CSVFileHandle::OpenFileHandle
          (FileSystem *fs,Allocator *allocator,OpenFileInfo *file,FileCompressionType compression)

{
  FileOpenFlags flags;
  bool bVar1;
  idx_t in_RCX;
  FileOpenFlags *in_RSI;
  __uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> in_RDI;
  FileCompressionType in_R8B;
  FileOpenFlags FVar2;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *file_handle;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  __uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> _Var3;
  OpenFileInfo *in_stack_ffffffffffffff98;
  optional_ptr<duckdb::FileOpener,_true> in_stack_ffffffffffffffa0;
  optional_ptr<duckdb::FileOpener,_true> opener;
  undefined2 uVar4;
  undefined6 uVar5;
  idx_t in_stack_ffffffffffffffb8;
  
  _Var3._M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  FileOpenFlags::FileOpenFlags((FileOpenFlags *)&stack0xffffffffffffffb8,in_R8B);
  FVar2._8_8_ = _Var3._M_t.
                super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  FVar2.flags = in_RCX;
  FVar2 = FileOpenFlags::operator|(in_RSI,FVar2);
  opener.ptr = (FileOpener *)FVar2.flags;
  uVar4 = FVar2._8_2_;
  uVar5 = FVar2._10_6_;
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr
            ((optional_ptr<duckdb::FileOpener,_true> *)&stack0xffffffffffffffa0,(FileOpener *)0x0);
  flags.flags._2_6_ = uVar5;
  flags.flags._0_2_ = uVar4;
  flags.lock = (char)in_stack_ffffffffffffffb8;
  flags.compression = (char)(in_stack_ffffffffffffffb8 >> 8);
  flags._10_6_ = (int6)(in_stack_ffffffffffffffb8 >> 0x10);
  FileSystem::OpenFile
            ((FileSystem *)in_stack_ffffffffffffffa0.ptr,in_stack_ffffffffffffff98,flags,opener);
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
            ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  bVar1 = FileHandle::CanSeek((FileHandle *)0x17644f2);
  if (bVar1) {
    unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
              ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff60));
    FileHandle::Reset((FileHandle *)0x176451b);
  }
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (_Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FileHandle> CSVFileHandle::OpenFileHandle(FileSystem &fs, Allocator &allocator, const OpenFileInfo &file,
                                                     FileCompressionType compression) {
	auto file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ | compression);
	if (file_handle->CanSeek()) {
		file_handle->Reset();
	}
	return file_handle;
}